

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void __thiscall
basist::decoder_etc_block::get_block_colors
          (decoder_etc_block *this,color32 *pBlock_colors,uint32_t subblock_index)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  color32 b;
  anon_union_4_3_898e29d3_for_color32_0 local_1c;
  
  bVar7 = (this->field_0).m_bytes[0];
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    if (subblock_index == 0) {
      bVar7 = bVar7 >> 4;
      bVar2 = (this->field_0).m_bytes[1] >> 4;
      bVar5 = (this->field_0).m_bytes[2] >> 4;
    }
    else {
      bVar7 = bVar7 & 0xf;
      bVar2 = (this->field_0).m_bytes[1] & 0xf;
      bVar5 = (this->field_0).m_bytes[2] & 0xf;
    }
    bVar5 = bVar2 << 4 | bVar5;
    local_1c.m = (bVar5 & 0xfffffff0 | (uint)bVar2) << 8 |
                 (bVar5 & 0xf) << 0x10 | (uint)bVar5 << 0x14 | (uint)bVar7 << 4 | (uint)bVar7 |
                 0xff000000;
  }
  else {
    bVar2 = (this->field_0).m_bytes[1] >> 3;
    bVar5 = (this->field_0).m_bytes[2] >> 3;
    if (subblock_index == 0) {
      local_1c.m = (((bVar2 & 0xfffffffc) << 6 | (uint)bVar2 << 0xb |
                    (bVar5 & 0xfffffffc) << 0xe | (uint)bVar5 << 0x13) +
                   (uint)(bVar7 >> 5) + (uint)(bVar7 >> 3) * 8) - 0x1000000;
    }
    else {
      unpack_color5((color32 *)&local_1c.field_0,
                    (ushort)(bVar7 >> 3) << 10 | (ushort)bVar5 | (ushort)bVar2 << 5,
                    (bVar7 & 7) << 6 |
                    ((this->field_0).m_bytes[2] & 7) + ((this->field_0).m_bytes[1] & 7) * 8,true,
                    0xff);
    }
  }
  if (1 < subblock_index) {
    __assert_fail("subblock_id < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x24a,"uint32_t basist::decoder_etc_block::get_inten_table(uint32_t) const");
  }
  uVar9 = (ulong)(((this->field_0).m_bytes[3] >> (subblock_index == 0) * '\x03' + 2 & 7) << 4);
  uVar3 = local_1c.m & 0xff;
  iVar1 = *(int *)((long)&g_etc1_inten_tables + uVar9);
  uVar4 = iVar1 + uVar3;
  if (0xff < uVar4) {
    if ((int)uVar4 < 0) {
      uVar4 = 0;
    }
    else if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
  }
  uVar6 = local_1c.m >> 8 & 0xff;
  uVar8 = iVar1 + uVar6;
  if (0xff < uVar8) {
    if ((int)uVar8 < 0) {
      uVar8 = 0;
    }
    else if (0xfe < (int)uVar8) {
      uVar8 = 0xff;
    }
  }
  uVar10 = iVar1 + (uint)local_1c.field_0.b;
  uVar11 = uVar10;
  if (0xff < uVar10) {
    if ((int)uVar10 < 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0xff;
      if ((int)uVar10 < 0xff) {
        uVar11 = uVar10;
      }
    }
  }
  (pBlock_colors->field_0).field_0.r = (uint8_t)uVar4;
  (pBlock_colors->field_0).field_0.g = (uint8_t)uVar8;
  (pBlock_colors->field_0).field_0.b = (uint8_t)uVar11;
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar1 = *(int *)((long)&DAT_0027fa84 + uVar9);
  uVar4 = iVar1 + uVar3;
  if (0xff < uVar4) {
    if ((int)uVar4 < 0) {
      uVar4 = 0;
    }
    else if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
  }
  uVar8 = iVar1 + uVar6;
  if (0xff < uVar8) {
    if ((int)uVar8 < 0) {
      uVar8 = 0;
    }
    else if (0xfe < (int)uVar8) {
      uVar8 = 0xff;
    }
  }
  uVar10 = iVar1 + (uint)local_1c.field_0.b;
  uVar11 = uVar10;
  if (0xff < uVar10) {
    if ((int)uVar10 < 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0xff;
      if ((int)uVar10 < 0xff) {
        uVar11 = uVar10;
      }
    }
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)uVar4;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)uVar8;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)uVar11;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  iVar1 = *(int *)((long)&DAT_0027fa88 + uVar9);
  uVar4 = iVar1 + uVar3;
  if (0xff < uVar4) {
    if ((int)uVar4 < 0) {
      uVar4 = 0;
    }
    else if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
  }
  uVar8 = iVar1 + uVar6;
  if (0xff < uVar8) {
    if ((int)uVar8 < 0) {
      uVar8 = 0;
    }
    else if (0xfe < (int)uVar8) {
      uVar8 = 0xff;
    }
  }
  uVar10 = iVar1 + (uint)local_1c.field_0.b;
  uVar11 = uVar10;
  if (0xff < uVar10) {
    if ((int)uVar10 < 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0xff;
      if ((int)uVar10 < 0xff) {
        uVar11 = uVar10;
      }
    }
  }
  pBlock_colors[2].field_0.field_0.r = (uint8_t)uVar4;
  pBlock_colors[2].field_0.field_0.g = (uint8_t)uVar8;
  pBlock_colors[2].field_0.field_0.b = (uint8_t)uVar11;
  pBlock_colors[2].field_0.field_0.a = 0xff;
  iVar1 = *(int *)((long)&DAT_0027fa8c + uVar9);
  uVar3 = uVar3 + iVar1;
  uVar4 = uVar3;
  if (0xff < uVar3) {
    if ((int)uVar3 < 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0xff;
      if ((int)uVar3 < 0xff) {
        uVar4 = uVar3;
      }
    }
  }
  uVar6 = uVar6 + iVar1;
  uVar3 = uVar6;
  if (0xff < uVar6) {
    if ((int)uVar6 < 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0xff;
      if ((int)uVar6 < 0xff) {
        uVar3 = uVar6;
      }
    }
  }
  uVar8 = iVar1 + (uint)local_1c.field_0.b;
  if (0xff < uVar8) {
    if ((int)uVar8 < 0) {
      uVar8 = 0;
    }
    else if (0xfe < (int)uVar8) {
      uVar8 = 0xff;
    }
  }
  pBlock_colors[3].field_0.field_0.r = (uint8_t)uVar4;
  pBlock_colors[3].field_0.field_0.g = (uint8_t)uVar3;
  pBlock_colors[3].field_0.field_0.b = (uint8_t)uVar8;
  pBlock_colors[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void get_block_colors(color32* pBlock_colors, uint32_t subblock_index) const
		{
			color32 b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true, 255);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true, 255);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			pBlock_colors[0].set_noclamp_rgba(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set_noclamp_rgba(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set_noclamp_rgba(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set_noclamp_rgba(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}